

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

string * __thiscall
miniros::NodeHandle::resolveName
          (string *__return_storage_ptr__,NodeHandle *this,string *name,char remap)

{
  ostream *poVar1;
  InvalidNameException *this_00;
  string final;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  if (*(long *)(name + 8) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::string((string *)&final,name);
    if (*final._M_dataplus._M_p != '/') {
      if (*final._M_dataplus._M_p == '~') {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::operator<<(local_1a0,
                        "Using ~ names with NodeHandle methods is not allowed.  If you want to use private names with the NodeHandle "
                       );
        std::operator<<(local_1a0,
                        "interface, construct a NodeHandle using a private name as its namespace.  e.g. "
                       );
        std::operator<<(local_1a0,"miniros::NodeHandle nh(\"~\");  ");
        std::operator<<(local_1a0,"nh.getParam(\"my_private_name\");");
        poVar1 = std::operator<<(local_1a0," (name = [");
        poVar1 = std::operator<<(poVar1,name);
        std::operator<<(poVar1,"])");
        this_00 = (InvalidNameException *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        InvalidNameException::InvalidNameException(this_00,&local_1d0);
        __cxa_throw(this_00,&InvalidNameException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((this->namespace_)._M_string_length != 0) {
        names::append((string *)&ss,&this->namespace_,&final);
        std::__cxx11::string::operator=((string *)&final,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
      }
    }
    names::clean((string *)&ss,&final);
    std::__cxx11::string::operator=((string *)&final,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if (remap != '\0') {
      remapName((string *)&ss,this,&final);
      std::__cxx11::string::operator=((string *)&final,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
    names::resolve(__return_storage_ptr__,&final,false);
    std::__cxx11::string::~string((string *)&final);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NodeHandle::resolveName(const std::string& name, bool remap, no_validate) const
{
  if (name.empty())
  {
    return namespace_;
  }

  std::string final = name;

  if (final[0] == '~')
  {
    std::stringstream ss;
    ss << "Using ~ names with NodeHandle methods is not allowed.  If you want to use private names with the NodeHandle ";
    ss << "interface, construct a NodeHandle using a private name as its namespace.  e.g. ";
    ss << "miniros::NodeHandle nh(\"~\");  ";
    ss << "nh.getParam(\"my_private_name\");";
    ss << " (name = [" << name << "])";
    throw InvalidNameException(ss.str());
  }
  else if (final[0] == '/')
  {
    // do nothing
  }
  else if (!namespace_.empty())
  {
    // MINIROS_DEBUG("Appending namespace_ (%s)", namespace_.c_str());
    final = names::append(namespace_, final);
  }

  // MINIROS_DEBUG("resolveName, pre-clean: %s", final.c_str());
  final = names::clean(final);
  // MINIROS_DEBUG("resolveName, post-clean: %s", final.c_str());

  if (remap)
  {
    final = remapName(final);
    // MINIROS_DEBUG("resolveName, remapped: %s", final.c_str());
  }

  return names::resolve(final, false);
}